

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SPIRVariable * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::allocate<spirv_cross::SPIRVariable&>
          (ObjectPool<spirv_cross::SPIRVariable> *this,SPIRVariable *p)

{
  Vector<spirv_cross::SPIRVariable_*> *this_00;
  uint32_t uVar1;
  ID IVar2;
  bool bVar3;
  undefined2 uVar4;
  bool bVar5;
  bool bVar6;
  BlockID BVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 uVar11;
  _Tuple_impl<0UL,_spirv_cross::SPIRVariable_*,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>
  _Var12;
  size_t sVar13;
  _Head_base<0UL,_spirv_cross::SPIRVariable_*,_false> _Var14;
  ulong count;
  SPIRVariable *pSVar15;
  
  this_00 = &this->vacants;
  sVar13 = (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size;
  if (sVar13 == 0) {
    count = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    _Var12.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>)malloc(count * 0xb0);
    if (_Var12.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl ==
        (SPIRVariable *)0x0) {
      return (SPIRVariable *)0x0;
    }
    SmallVector<spirv_cross::SPIRVariable_*,_0UL>::reserve(this_00,count);
    if (count != 0) {
      sVar13 = (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size;
      _Var14._M_head_impl =
           (SPIRVariable *)
           _Var12.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl;
      do {
        SmallVector<spirv_cross::SPIRVariable_*,_0UL>::reserve(this_00,sVar13 + 1);
        sVar13 = (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size;
        (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.ptr[sVar13] =
             _Var14._M_head_impl;
        sVar13 = sVar13 + 1;
        (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size = sVar13;
        _Var14._M_head_impl = _Var14._M_head_impl + 1;
        count = count - 1;
      } while (count != 0);
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>,_8UL>
    ::reserve(&this->memory,
              (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
              .buffer_size + 1);
    sVar13 = (this->memory).
             super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
             .buffer_size;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
    .ptr[sVar13]._M_t.
    super___uniq_ptr_impl<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_spirv_cross::SPIRVariable_*,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>
    .super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false> =
         _Var12.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
    .buffer_size = sVar13 + 1;
    sVar13 = (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size;
    pSVar15 = (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.ptr[sVar13 - 1];
    if (sVar13 == 0) goto LAB_00196712;
  }
  else {
    pSVar15 = (this_00->super_VectorView<spirv_cross::SPIRVariable_*>).ptr[sVar13 - 1];
  }
  SmallVector<spirv_cross::SPIRVariable_*,_0UL>::resize(this_00,sVar13 - 1);
LAB_00196712:
  (pSVar15->super_IVariant).self.id = (p->super_IVariant).self.id;
  (pSVar15->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRVariable_003a3038;
  uVar1 = p->decoration;
  IVar2.id = (p->initializer).id;
  *(undefined8 *)&(pSVar15->super_IVariant).field_0xc =
       *(undefined8 *)&(p->super_IVariant).field_0xc;
  pSVar15->decoration = uVar1;
  pSVar15->initializer = (ID)IVar2.id;
  (pSVar15->basevariable).id = (p->basevariable).id;
  (pSVar15->dereference_chain).super_VectorView<unsigned_int>.buffer_size = 0;
  (pSVar15->dereference_chain).super_VectorView<unsigned_int>.ptr =
       (uint *)&(pSVar15->dereference_chain).stack_storage;
  (pSVar15->dereference_chain).buffer_capacity = 8;
  SmallVector<unsigned_int,_8UL>::operator=(&pSVar15->dereference_chain,&p->dereference_chain);
  bVar3 = p->statically_assigned;
  uVar4 = *(undefined2 *)&p->field_0x5a;
  IVar2.id = (p->static_expression).id;
  pSVar15->compat_builtin = p->compat_builtin;
  pSVar15->statically_assigned = bVar3;
  *(undefined2 *)&pSVar15->field_0x5a = uVar4;
  pSVar15->static_expression = (ID)IVar2.id;
  (pSVar15->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size =
       0;
  (pSVar15->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr =
       (TypedID<(spirv_cross::Types)0> *)&(pSVar15->dependees).stack_storage;
  (pSVar15->dependees).buffer_capacity = 8;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::operator=
            (&pSVar15->dependees,&p->dependees);
  bVar3 = p->phi_variable;
  bVar5 = p->allocate_temporary_copy;
  bVar6 = p->remapped_variable;
  uVar1 = p->remapped_components;
  BVar7.id = (p->dominator).id;
  bVar8 = p->loop_variable;
  bVar9 = p->loop_variable_enable;
  bVar10 = p->is_written_to;
  uVar11 = p->field_0xa7;
  pSVar15->deferred_declaration = p->deferred_declaration;
  pSVar15->phi_variable = bVar3;
  pSVar15->allocate_temporary_copy = bVar5;
  pSVar15->remapped_variable = bVar6;
  pSVar15->remapped_components = uVar1;
  pSVar15->dominator = (BlockID)BVar7.id;
  pSVar15->loop_variable = bVar8;
  pSVar15->loop_variable_enable = bVar9;
  pSVar15->is_written_to = bVar10;
  pSVar15->field_0xa7 = uVar11;
  pSVar15->parameter = p->parameter;
  return pSVar15;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}